

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcClp.c
# Opt level: O1

Vec_Str_t *
Bmc_CollapseOne3(Gia_Man_t *p,int nCubeLim,int nBTLimit,int fCanon,int fReverse,int fVerbose)

{
  Cnf_Dat_t *p_00;
  sat_solver *pSat0;
  sat_solver *pSat1;
  sat_solver *pSat2;
  sat_solver *pSat3;
  Vec_Str_t *pVVar1;
  
  p_00 = Mf_ManGenerateCnf(p,8,0,0,0);
  pSat0 = (sat_solver *)Cnf_DataWriteIntoSolver(p_00,1,0);
  pSat1 = (sat_solver *)Cnf_DataWriteIntoSolver(p_00,1,0);
  pSat2 = (sat_solver *)Cnf_DataWriteIntoSolver(p_00,1,0);
  pSat3 = (sat_solver *)Cnf_DataWriteIntoSolver(p_00,1,0);
  pVVar1 = Bmc_CollapseOne_int3
                     (pSat0,pSat1,pSat2,pSat3,p->vCis->nSize,nCubeLim,nBTLimit,fCanon,fReverse,
                      fVerbose);
  sat_solver_delete(pSat0);
  sat_solver_delete(pSat1);
  sat_solver_delete(pSat2);
  sat_solver_delete(pSat3);
  Cnf_DataFree(p_00);
  return pVVar1;
}

Assistant:

Vec_Str_t * Bmc_CollapseOne3( Gia_Man_t * p, int nCubeLim, int nBTLimit, int fCanon, int fReverse, int fVerbose )
{
    Cnf_Dat_t * pCnf = Mf_ManGenerateCnf( p, 8, 0, 0, 0 );
    sat_solver * pSat0 = (sat_solver *)Cnf_DataWriteIntoSolver(pCnf, 1, 0);
    sat_solver * pSat1 = (sat_solver *)Cnf_DataWriteIntoSolver(pCnf, 1, 0);
    sat_solver * pSat2 = (sat_solver *)Cnf_DataWriteIntoSolver(pCnf, 1, 0);
    sat_solver * pSat3 = (sat_solver *)Cnf_DataWriteIntoSolver(pCnf, 1, 0);
    Vec_Str_t * vSop = Bmc_CollapseOne_int3( pSat0, pSat1, pSat2, pSat3, Gia_ManCiNum(p), nCubeLim, nBTLimit, fCanon, fReverse, fVerbose );
    sat_solver_delete( pSat0 );
    sat_solver_delete( pSat1 );
    sat_solver_delete( pSat2 );
    sat_solver_delete( pSat3 );
    Cnf_DataFree( pCnf );
    return vSop;
}